

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

OPJ_FLOAT64 opj_dwt_getnorm(OPJ_UINT32 level,OPJ_UINT32 orient)

{
  uint local_c;
  OPJ_UINT32 orient_local;
  OPJ_UINT32 level_local;
  
  if ((orient == 0) && (9 < level)) {
    local_c = 9;
  }
  else {
    local_c = level;
    if ((orient != 0) && (8 < level)) {
      local_c = 8;
    }
  }
  return opj_dwt_norms[orient][local_c];
}

Assistant:

OPJ_FLOAT64 opj_dwt_getnorm(OPJ_UINT32 level, OPJ_UINT32 orient)
{
    /* FIXME ! This is just a band-aid to avoid a buffer overflow */
    /* but the array should really be extended up to 33 resolution levels */
    /* See https://github.com/uclouvain/openjpeg/issues/493 */
    if (orient == 0 && level >= 10) {
        level = 9;
    } else if (orient > 0 && level >= 9) {
        level = 8;
    }
    return opj_dwt_norms[orient][level];
}